

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTTClient.cpp
# Opt level: O3

void __thiscall Network::Client::ScopedLock::ScopedLock(ScopedLock *this,Lock *a)

{
  __int_type _Var1;
  timeval local_20;
  
  this->a = a;
  LOCK();
  _Var1 = (a->state)._M_base._M_i;
  (a->state)._M_base._M_i = true;
  UNLOCK();
  if ((_Var1 & 1U) != 0) {
    do {
      local_20.tv_sec = 0;
      local_20.tv_usec = 0x3d1;
      select(0,(fd_set *)0x0,(fd_set *)0x0,(fd_set *)0x0,&local_20);
      LOCK();
      _Var1 = (a->state)._M_base._M_i;
      (a->state)._M_base._M_i = true;
      UNLOCK();
    } while ((_Var1 & 1U) != 0);
  }
  return;
}

Assistant:

ScopedLock(Lock & a) : a(a) { a.acquire(); }